

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::scatter_big<std::pair<int,double>>
               (pair<int,_double> *msgs,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  datatype dt;
  datatype dt_1;
  
  dt_1.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  dt_1.builtin = false;
  datatype::contiguous(&dt,&dt_1,size);
  datatype::~datatype(&dt_1);
  MPI_Scatter(msgs,1,dt.mpitype,out,1,dt.mpitype,root,comm->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

void scatter_big(const T* msgs, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm()) {
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Scatter(const_cast<T*>(msgs), 1, dt.type(), out, 1, dt.type(), root, comm);
}